

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imgui_draw.cpp
# Opt level: O1

void __thiscall ImDrawData::ScaleClipRects(ImDrawData *this,ImVec2 *fb_scale)

{
  float *pfVar1;
  float *pfVar2;
  int iVar3;
  ImDrawList **ppIVar4;
  ImDrawCmd *pIVar5;
  float fVar6;
  float fVar7;
  float fVar8;
  long lVar9;
  long lVar10;
  long lVar11;
  float fVar12;
  float fVar13;
  
  iVar3 = this->CmdListsCount;
  if (0 < (long)iVar3) {
    ppIVar4 = this->CmdLists;
    lVar9 = 0;
    do {
      lVar10 = (long)(ppIVar4[lVar9]->CmdBuffer).Size;
      if (0 < lVar10) {
        pIVar5 = (ppIVar4[lVar9]->CmdBuffer).Data;
        lVar11 = 0;
        do {
          pfVar1 = (float *)((long)&(pIVar5->ClipRect).x + lVar11);
          fVar6 = pfVar1[1];
          fVar7 = pfVar1[2];
          fVar8 = pfVar1[3];
          fVar12 = (*fb_scale).x;
          fVar13 = (*fb_scale).y;
          pfVar2 = (float *)((long)&(pIVar5->ClipRect).x + lVar11);
          *pfVar2 = *pfVar1 * fVar12;
          pfVar2[1] = fVar6 * fVar13;
          pfVar2[2] = fVar7 * fVar12;
          pfVar2[3] = fVar8 * fVar13;
          lVar11 = lVar11 + 0x38;
        } while (lVar10 * 0x38 - lVar11 != 0);
      }
      lVar9 = lVar9 + 1;
    } while (lVar9 != iVar3);
  }
  return;
}

Assistant:

void ImDrawData::ScaleClipRects(const ImVec2& fb_scale)
{
    for (int i = 0; i < CmdListsCount; i++)
    {
        ImDrawList* cmd_list = CmdLists[i];
        for (int cmd_i = 0; cmd_i < cmd_list->CmdBuffer.Size; cmd_i++)
        {
            ImDrawCmd* cmd = &cmd_list->CmdBuffer[cmd_i];
            cmd->ClipRect = ImVec4(cmd->ClipRect.x * fb_scale.x, cmd->ClipRect.y * fb_scale.y, cmd->ClipRect.z * fb_scale.x, cmd->ClipRect.w * fb_scale.y);
        }
    }
}